

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O3

bool vkt::pipeline::isVertexFormatSRGB(VkFormat format)

{
  return (bool)((byte)(0x4081020408000 >> ((byte)format & 0x3f)) &
               format < VK_FORMAT_A8B8G8R8_UNORM_PACK32);
}

Assistant:

bool isVertexFormatSRGB (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_SRGB:
		case VK_FORMAT_R8G8_SRGB:
		case VK_FORMAT_R8G8B8_SRGB:
		case VK_FORMAT_B8G8R8_SRGB:
		case VK_FORMAT_R8G8B8A8_SRGB:
		case VK_FORMAT_B8G8R8A8_SRGB:
			return true;

		default:
			break;
	}

	return false;

}